

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderExecUtil.cpp
# Opt level: O2

string * __thiscall
deqp::gls::ShaderExecUtil::ComputeShaderExecutor::generateComputeShader_abi_cxx11_
          (string *__return_storage_ptr__,ComputeShaderExecutor *this,ShaderSpec *spec)

{
  char *pcVar1;
  ostream *poVar2;
  ostringstream src;
  ostream oStack_188;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oStack_188);
  pcVar1 = glu::getGLSLVersionDeclaration
                     (*(GLSLVersion *)
                       &(this->super_BufferIoExecutor).super_ShaderExecutor._vptr_ShaderExecutor);
  poVar2 = std::operator<<(&oStack_188,pcVar1);
  std::operator<<(poVar2,"\n");
  if ((this->super_BufferIoExecutor).m_program.m_shaders[0].
      super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    poVar2 = std::operator<<(&oStack_188,
                             (string *)
                             &(this->super_BufferIoExecutor).super_ShaderExecutor.m_outputs.
                              super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::operator<<(poVar2,"\n");
  }
  poVar2 = std::operator<<(&oStack_188,"layout(local_size_x = 1) in;\n");
  std::operator<<(poVar2,"\n");
  BufferIoExecutor::declareBufferBlocks(&oStack_188,(ShaderSpec *)this);
  poVar2 = std::operator<<(&oStack_188,"void main (void)\n");
  poVar2 = std::operator<<(poVar2,"{\n");
  poVar2 = std::operator<<(poVar2,
                           "\tuint invocationNdx = gl_NumWorkGroups.x*gl_NumWorkGroups.y*gl_WorkGroupID.z\n"
                          );
  std::operator<<(poVar2,
                  "\t                   + gl_NumWorkGroups.x*gl_WorkGroupID.y + gl_WorkGroupID.x;\n"
                 );
  BufferIoExecutor::generateExecBufferIo(&oStack_188,(ShaderSpec *)this,"invocationNdx");
  std::operator<<(&oStack_188,"}\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oStack_188);
  return __return_storage_ptr__;
}

Assistant:

std::string ComputeShaderExecutor::generateComputeShader (const ShaderSpec& spec)
{
	std::ostringstream src;

	src << glu::getGLSLVersionDeclaration(spec.version) << "\n";

	if (!spec.globalDeclarations.empty())
		src << spec.globalDeclarations << "\n";

	src << "layout(local_size_x = 1) in;\n"
		<< "\n";

	declareBufferBlocks(src, spec);

	src << "void main (void)\n"
		<< "{\n"
		<< "	uint invocationNdx = gl_NumWorkGroups.x*gl_NumWorkGroups.y*gl_WorkGroupID.z\n"
		<< "	                   + gl_NumWorkGroups.x*gl_WorkGroupID.y + gl_WorkGroupID.x;\n";

	generateExecBufferIo(src, spec, "invocationNdx");

	src << "}\n";

	return src.str();
}